

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-metadce.cpp
# Opt level: O1

void __thiscall MetaDCEGraph::scanWebAssembly(MetaDCEGraph *this)

{
  pointer *ppuVar1;
  pointer *ppNVar2;
  pointer puVar3;
  Export *__k;
  Export *pEVar4;
  long lVar5;
  iterator __position;
  pointer pbVar6;
  long *plVar7;
  undefined8 *puVar8;
  pointer pcVar9;
  __node_base_ptr p_Var10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  mapped_type *pmVar13;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  pointer puVar14;
  __hashtable *__h;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment;
  pointer pcVar15;
  long *plVar16;
  _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_3a8;
  Module *local_3a0;
  MixedArena *local_398;
  undefined8 local_390;
  undefined1 uStack_388;
  undefined7 uStack_387;
  undefined1 uStack_380;
  undefined8 uStack_37f;
  undefined2 local_377;
  undefined8 local_374;
  undefined8 uStack_36c;
  undefined4 local_364;
  undefined1 local_360;
  undefined5 local_35c;
  undefined3 uStack_357;
  undefined5 uStack_354;
  undefined1 local_340;
  undefined1 local_338;
  undefined8 *local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined4 local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 *local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined4 local_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined2 local_2c0;
  undefined1 auStack_2b8 [8];
  Name dceName;
  undefined1 auStack_1c8 [8];
  InitScanner scanner;
  string local_80;
  string local_60;
  Module *local_40;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_38;
  
  wasm::ModuleUtils::
  iterModuleItems<MetaDCEGraph::scanWebAssembly()::_lambda(wasm::ModuleItemKind,wasm::Named*)_1_>
            (this->wasm,(anon_class_8_1_8991fb9c)this);
  puVar14 = (this->wasm->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->wasm->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar14 != puVar3) {
    this_00 = &(this->exportToDCENode)._M_h;
    local_40 = (Module *)this;
    local_38 = this_00;
    do {
      __k = (puVar14->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
            super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if (__k[0x28] == (Export)0x0) {
        p_Var10 = std::
                  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::_M_find_before_node
                            (this_00,(ulong)*(char **)(__k + 8) %
                                     (ulong)(((Module *)this)->memories).
                                            super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                             (key_type *)__k,(__hash_code)*(char **)(__k + 8));
        if ((p_Var10 == (__node_base_ptr)0x0) || (p_Var10->_M_nxt == (_Hash_node_base *)0x0)) {
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"export","");
          pEVar4 = (puVar14->_M_t).
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          lVar5 = *(long *)(pEVar4 + 8);
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_80,lVar5,*(long *)pEVar4 + lVar5);
          _auStack_2b8 = (string_view)getName(this,&local_60,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          pmVar11 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_38,
                                 (key_type *)
                                 (puVar14->_M_t).
                                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                 .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
          (pmVar11->super_IString).str._M_len = (size_t)auStack_2b8;
          (pmVar11->super_IString).str._M_str = (char *)dceName.super_IString.str._M_len;
          _auStack_1c8 = _auStack_2b8;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.usedFixed = 0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[0].func
               = (TaskFunc)0x0;
          scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[0].currp
               = (Expression **)0x0;
          pmVar12 = std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)local_40,(key_type *)auStack_2b8);
          *(undefined4 *)&(pmVar12->name).super_IString.str._M_len = auStack_1c8._0_4_;
          *(undefined4 *)((long)&(pmVar12->name).super_IString.str._M_len + 4) = auStack_1c8._4_4_;
          *(undefined4 *)&(pmVar12->name).super_IString.str._M_str =
               scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
               super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep._0_4_;
          *(undefined4 *)((long)&(pmVar12->name).super_IString.str._M_str + 4) =
               scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
               super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep._4_4_;
          std::vector<wasm::Name,_std::allocator<wasm::Name>_>::_M_move_assign
                    (&pmVar12->reaches,
                     &scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                      super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack);
          this = (MetaDCEGraph *)local_40;
          if (scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
              super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.usedFixed != 0) {
            operator_delete((void *)scanner.
                                    super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                                    .super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                                    stack.usedFixed,
                            (long)scanner.
                                  super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                                  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack
                                  .fixed._M_elems[0].currp -
                            scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>
                            .super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.
                            usedFixed);
            this = (MetaDCEGraph *)local_40;
          }
        }
        this_00 = local_38;
        pmVar11 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_38,
                               (key_type *)
                               (puVar14->_M_t).
                               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                               .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl);
        pmVar12 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_DCENode>,_std::allocator<std::pair<const_wasm::Name,_DCENode>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this,pmVar11);
        _auStack_1c8 = (string_view)
                       getDCEName(this,*(ModuleItemKind *)
                                        ((puVar14->_M_t).
                                         super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                         .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl
                                        + 0x10),(IString)*(IString *)(__k + 0x18));
        __position._M_current =
             (pmVar12->reaches).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pmVar12->reaches).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wasm::Name,_std::allocator<wasm::Name>_>::_M_realloc_insert<wasm::Name>
                    (&pmVar12->reaches,__position,(Name *)auStack_1c8);
        }
        else {
          *(undefined4 *)&((__position._M_current)->super_IString).str._M_len = auStack_1c8._0_4_;
          *(undefined4 *)((long)&((__position._M_current)->super_IString).str._M_len + 4) =
               auStack_1c8._4_4_;
          *(undefined4 *)&((__position._M_current)->super_IString).str._M_str =
               scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
               super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep._0_4_;
          *(undefined4 *)((long)&((__position._M_current)->super_IString).str._M_str + 4) =
               scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
               super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep._4_4_;
          ppNVar2 = &(pmVar12->reaches).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppNVar2 = *ppNVar2 + 1;
        }
      }
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar3);
  }
  pbVar6 = (((Module *)this)->debugInfoSymbolNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  plVar16 = (long *)pbVar6[1].field_2._M_allocated_capacity;
  plVar7 = *(long **)((long)&pbVar6[1].field_2 + 8);
  if (plVar16 != plVar7) {
    local_38 = (_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&((Module *)this)->tables;
    do {
      puVar8 = (undefined8 *)*plVar16;
      if (puVar8[4] == 0) {
        auStack_2b8._0_4_ = 3;
        dceName.super_IString.str._M_str = (char *)puVar8[1];
        dceName.super_IString.str._M_len = (size_t)*puVar8;
        pmVar13 = std::__detail::
                  _Map_base<std::pair<wasm::ModuleItemKind,_wasm::Name>,_std::pair<const_std::pair<wasm::ModuleItemKind,_wasm::Name>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::ModuleItemKind,_wasm::Name>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::ModuleItemKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ModuleItemKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::pair<wasm::ModuleItemKind,_wasm::Name>,_std::pair<const_std::pair<wasm::ModuleItemKind,_wasm::Name>,_wasm::Name>,_std::allocator<std::pair<const_std::pair<wasm::ModuleItemKind,_wasm::Name>,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<wasm::ModuleItemKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ModuleItemKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_38,(key_type *)auStack_2b8);
        scanner.parent = (MetaDCEGraph *)(pmVar13->super_IString).str._M_len;
        scanner.parentDceName.super_IString.str._M_len = (size_t)(pmVar13->super_IString).str._M_str
        ;
        _auStack_1c8 = (string_view)ZEXT816(0);
        scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[9].currp =
             (Expression **)0x0;
        scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.currFunction =
             (Function *)
             (((Module *)this)->debugInfoSymbolNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
        super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.currModule = (Module *)this;
        wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::walk
                  ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)auStack_1c8,
                   (Expression **)(puVar8 + 8));
        if (scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
            super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[9].
            currp != (Expression **)0x0) {
          operator_delete(scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                          super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed.
                          _M_elems[9].currp,
                          (long)scanner.
                                super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                                super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.
                                flexible.
                                super__Vector_base<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task,_std::allocator<wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::Task>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)scanner.
                                super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                                super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.
                                fixed._M_elems[9].currp);
        }
      }
      plVar16 = plVar16 + 1;
    } while (plVar16 != plVar7);
  }
  _auStack_2b8 = (string_view)ZEXT816(0);
  pbVar6 = (((Module *)this)->debugInfoSymbolNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.replacep = (Expression **)auStack_2b8
  ;
  auStack_1c8 = (undefined1  [8])this;
  pcVar15 = pbVar6[3]._M_dataplus._M_p;
  pcVar9 = (pointer)pbVar6[3]._M_string_length;
  if (pcVar15 != pcVar9) {
    do {
      if (*(long *)(*(ElementSegment **)pcVar15 + 0x20) != 0) {
        scanWebAssembly::anon_class_16_2_51b3ad0a::operator()
                  ((anon_class_16_2_51b3ad0a *)auStack_1c8,*(ElementSegment **)pcVar15);
      }
      pcVar15 = pcVar15 + 8;
    } while (pcVar15 != pcVar9);
  }
  pbVar6 = (((Module *)this)->debugInfoSymbolNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  plVar16 = (long *)pbVar6[4].field_2._M_allocated_capacity;
  plVar7 = *(long **)((long)&pbVar6[4].field_2 + 8);
  if (plVar16 != plVar7) {
    ppuVar1 = &(((Module *)this)->globals).
               super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    do {
      lVar5 = *plVar16;
      if (*(char *)(lVar5 + 0x28) == '\0') {
        wasm::Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>::walk
                  ((Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_> *)auStack_2b8,
                   (Expression **)(lVar5 + 0x30));
        _auStack_1c8 = (string_view)getDCEName(this,DataSegment,(IString)*(IString *)lVar5);
        local_3a8 = (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                     *)ppuVar1;
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)ppuVar1,auStack_1c8,&local_3a8);
      }
      plVar16 = plVar16 + 1;
    } while (plVar16 != plVar7);
  }
  local_3a0 = (Module *)
              (((Module *)this)->debugInfoSymbolNames).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_330 = &uStack_300;
  local_3a8 = (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               *)std::_Rb_tree_increment;
  local_398 = &local_3a0->allocator;
  local_390 = 0;
  uStack_388 = 0;
  uStack_387 = 0;
  uStack_380 = 0;
  uStack_37f = 0;
  local_377 = 0x101;
  local_374 = 0;
  uStack_36c = 0xffffffff00000002;
  local_364 = 0x14;
  local_360 = 0;
  local_340 = 0;
  local_338 = 0;
  local_35c = 0;
  uStack_357 = 0;
  uStack_354 = 0;
  local_328 = 1;
  local_320 = 0;
  uStack_318 = 0;
  local_310 = 0x3f800000;
  local_308 = 0;
  uStack_300 = 0;
  local_2f8 = &uStack_2c8;
  local_2f0 = 1;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_2d8 = 0x3f800000;
  local_2d0 = 0;
  uStack_2c8 = 0;
  local_2c0 = 0;
  scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.usedFixed =
       (size_t)&scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
                super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[0]
                .currp;
  scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[0].func =
       (TaskFunc)0x0;
  scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[0].currp =
       (Expression **)
       ((ulong)scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
               super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[0].
               currp & 0xffffffffffffff00);
  scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[3].currp._0_1_ =
       0;
  scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[4].func =
       (TaskFunc)0x0;
  scanner.super_PostWalker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.
  super_Walker<InitScanner,_wasm::Visitor<InitScanner,_void>_>.stack.fixed._M_elems[4].currp =
       (Expression **)0x0;
  _auStack_1c8 = (string_view)ZEXT816(0x137cc0);
  wasm::WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>::run
            ((WalkerPass<wasm::PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>_>
              *)auStack_1c8,(PassRunner *)&local_3a8,local_3a0);
  wasm::Pass::~Pass((Pass *)auStack_1c8);
  wasm::PassRunner::~PassRunner((PassRunner *)&local_3a8);
  return;
}

Assistant:

void scanWebAssembly() {
    // Add an entry for everything we might need ahead of time, so parallel work
    // does not alter parent state, just adds to things pointed by it,
    // independently (each thread will add for one function, etc.)
    ModuleUtils::iterModuleItems(wasm, [&](ModuleItemKind kind, Named* item) {
      if (auto* import = wasm.getImportOrNull(kind, item->name)) {
        auto id = getImportId(import->module, import->base);
        if (importIdToDCENode.find(id) == importIdToDCENode.end()) {
          auto dceName = getName("importId", import->name.toString());
          importIdToDCENode[id] = dceName;
        }
        return;
      }
      auto dceName = getName(kindPrefixes[kind], item->name.toString());
      itemToDCENode[{kind, item->name}] = dceName;
      nodes[dceName] = DCENode(dceName);
    });
    for (auto& exp : wasm.exports) {
      // skip type exports
      // TODO: shall we keep track of type dependencies?
      if (auto* name = exp->getInternalName()) {
        if (exportToDCENode.find(exp->name) == exportToDCENode.end()) {
          auto dceName = getName("export", exp->name.toString());
          exportToDCENode[exp->name] = dceName;
          nodes[dceName] = DCENode(dceName);
        }
        // we can also link the export to the thing being exported
        auto& node = nodes[exportToDCENode[exp->name]];
        node.reaches.push_back(getDCEName(ModuleItemKind(exp->kind), *name));
      }
    }
    // Add initializer dependencies
    // if we provide a parent DCE name, that is who can reach what we see
    // if none is provided, then it is something we must root
    struct InitScanner : public PostWalker<InitScanner> {
      InitScanner(MetaDCEGraph* parent, Name parentDceName)
        : parent(parent), parentDceName(parentDceName) {}

      void visitGlobalGet(GlobalGet* curr) { handleGlobal(curr->name); }
      void visitGlobalSet(GlobalSet* curr) { handleGlobal(curr->name); }
      void visitRefFunc(RefFunc* curr) {
        assert(!parentDceName.isNull());
        parent->nodes[parentDceName].reaches.push_back(
          parent->getDCEName(ModuleItemKind::Function, curr->func));
      }

    private:
      MetaDCEGraph* parent;
      Name parentDceName;

      void handleGlobal(Name name) {
        Name dceName;
        if (!getModule()->getGlobal(name)->imported()) {
          // its a defined global
          dceName = parent->itemToDCENode[{ModuleItemKind::Global, name}];
        } else {
          // it's an import.
          dceName = parent->importIdToDCENode[parent->getImportId(
            ModuleItemKind::Global, name)];
        }
        if (parentDceName.isNull()) {
          parent->roots.insert(dceName);
        } else {
          parent->nodes[parentDceName].reaches.push_back(dceName);
        }
      }
    };
    ModuleUtils::iterDefinedGlobals(wasm, [&](Global* global) {
      InitScanner scanner(
        this, itemToDCENode[{ModuleItemKind::Global, global->name}]);
      scanner.setModule(&wasm);
      scanner.walk(global->init);
    });
    // We can't remove active segments, so root them and what they use.
    // TODO: treat them as in a cycle with their parent memory/table
    InitScanner rooter(this, Name());
    rooter.setModule(&wasm);
    ModuleUtils::iterActiveElementSegments(wasm, [&](ElementSegment* segment) {
      // TODO: currently, all functions in the table are roots, but we
      //       should add an option to refine that
      ElementUtils::iterElementSegmentFunctionNames(
        segment, [&](Name name, Index) {
          roots.insert(getDCEName(ModuleItemKind::Function, name));
        });
      rooter.walk(segment->offset);
      roots.insert(getDCEName(ModuleItemKind::ElementSegment, segment->name));
    });
    ModuleUtils::iterActiveDataSegments(wasm, [&](DataSegment* segment) {
      rooter.walk(segment->offset);
      roots.insert(getDCEName(ModuleItemKind::DataSegment, segment->name));
    });

    // A parallel scanner for function bodies
    struct Scanner : public WalkerPass<
                       PostWalker<Scanner, UnifiedExpressionVisitor<Scanner>>> {
      bool isFunctionParallel() override { return true; }

      Scanner(MetaDCEGraph* parent) : parent(parent) {}

      std::unique_ptr<Pass> create() override {
        return std::make_unique<Scanner>(parent);
      }

      void visitExpression(Expression* curr) {
#define DELEGATE_ID curr->_id

#define DELEGATE_START(id) [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_CHILD(id, field)
#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)
#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#define DELEGATE_FIELD_NAME_KIND(id, field, kind)                              \
  if (cast->field.is()) {                                                      \
    handle(kind, cast->field);                                                 \
  }

#include "wasm-delegations-fields.def"
      }

    private:
      MetaDCEGraph* parent;

      void handle(ModuleItemKind kind, Name name) {
        getCurrentFunctionDCENode().reaches.push_back(
          parent->getDCEName(kind, name));
      }

      DCENode& getCurrentFunctionDCENode() {
        return parent->nodes[parent->itemToDCENode[{ModuleItemKind::Function,
                                                    getFunction()->name}]];
      }
    };

    PassRunner runner(&wasm);
    Scanner(this).run(&runner, &wasm);
  }